

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint i;
  long lVar1;
  bool bVar2;
  int pc;
  char *pcVar3;
  long *plVar4;
  ulong uVar5;
  int local_30;
  int local_2c;
  
  local_30 = lastpc;
  pcVar3 = basicgetobjname(p,&local_30,reg,name);
  pc = local_30;
  if (pcVar3 != (char *)0x0) {
    return pcVar3;
  }
  if ((long)local_30 == -1) goto LAB_0010aeec;
  i = p->code[local_30];
  bVar2 = true;
  pcVar3 = (char *)(ulong)((i & 0x7f) - 0xb);
  switch(pcVar3) {
  case (char *)0x0:
    uVar5 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar5] & 0xf) == 4) {
      lVar1 = *(long *)((long)&p->k->value_ + uVar5);
      plVar4 = (long *)(lVar1 + 0x18);
      if (*(char *)(lVar1 + 0xb) < '\0') {
        plVar4 = (long *)*plVar4;
      }
    }
    else {
      plVar4 = (long *)0x129a0a;
    }
    *name = (char *)plVar4;
    pcVar3 = isEnv(p,local_30,i,1);
    break;
  case (char *)0x1:
    local_2c = local_30;
    pcVar3 = basicgetobjname(p,&local_2c,i >> 0x18,name);
    if ((pcVar3 == (char *)0x0) || (*pcVar3 != 'c')) {
LAB_0010ae67:
      plVar4 = (long *)0x129a0a;
      goto LAB_0010ae6e;
    }
    goto LAB_0010ae71;
  case (char *)0x2:
    *name = "integer index";
    pcVar3 = "field";
    break;
  case (char *)0x3:
    uVar5 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar5] & 0xf) != 4) goto LAB_0010ae67;
    lVar1 = *(long *)((long)&p->k->value_ + uVar5);
    plVar4 = (long *)(lVar1 + 0x18);
    if (*(char *)(lVar1 + 0xb) < '\0') {
      plVar4 = (long *)*plVar4;
    }
LAB_0010ae6e:
    *name = (char *)plVar4;
LAB_0010ae71:
    bVar2 = false;
    pcVar3 = isEnv(p,pc,i,0);
  default:
    goto switchD_0010adc3_caseD_4;
  case (char *)0x9:
    uVar5 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar5] & 0xf) == 4) {
      lVar1 = *(long *)((long)&p->k->value_ + uVar5);
      plVar4 = (long *)(lVar1 + 0x18);
      if (*(char *)(lVar1 + 0xb) < '\0') {
        plVar4 = (long *)*plVar4;
      }
    }
    else {
      plVar4 = (long *)0x129a0a;
    }
    *name = (char *)plVar4;
    pcVar3 = "method";
  }
  bVar2 = false;
switchD_0010adc3_caseD_4:
  if (bVar2) {
LAB_0010aeec:
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  const char *kind = basicgetobjname(p, &lastpc, reg, name);
  if (kind != NULL)
    return kind;
  else if (lastpc != -1) {  /* could find instruction? */
    Instruction i = p->code[lastpc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, lastpc, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}